

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BgzfStream::Open(BgzfStream *this,string *filename,OpenMode mode)

{
  uint uVar1;
  IBamIODevice *pIVar2;
  undefined8 uVar3;
  uint in_EDX;
  BgzfStream *in_RDI;
  string message;
  string deviceError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  allocator *paVar4;
  RuleToken *__lhs;
  allocator local_b1;
  string local_b0 [8];
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  BamException *in_stack_ffffffffffffff70;
  undefined1 local_79 [65];
  undefined1 local_38 [36];
  uint local_14;
  
  local_14 = in_EDX;
  Close(in_RDI);
  bamtools_noop();
  pIVar2 = BamDeviceFactory::CreateDevice(in_stack_ffffffffffffff58);
  in_RDI->m_device = pIVar2;
  bamtools_noop();
  uVar1 = (*in_RDI->m_device->_vptr_IBamIODevice[4])(in_RDI->m_device,(ulong)local_14);
  if ((uVar1 & 1) == 0) {
    (*in_RDI->m_device->_vptr_IBamIODevice[9])(local_38);
    __lhs = (RuleToken *)local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_79 + 1),"could not open BGZF stream: \n\t",(allocator *)__lhs);
    std::operator+(__lhs,in_stack_ffffffffffffff30);
    std::__cxx11::string::~string((string *)(local_79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
    uVar3 = __cxa_allocate_exception(0x28);
    paVar4 = &local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"BgzfStream::Open",paVar4);
    BamException::BamException
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    __cxa_throw(uVar3,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BgzfStream::Open(const std::string& filename, const IBamIODevice::OpenMode mode)
{

    // close current device if necessary
    Close();
    BT_ASSERT_X((m_device == 0),
                "BgzfStream::Open() - unable to properly close previous IO device");

    // retrieve new IO device depending on filename
    m_device = BamDeviceFactory::CreateDevice(filename);
    BT_ASSERT_X(m_device, "BgzfStream::Open() - unable to create IO device from filename");

    // if device fails to open
    if (!m_device->Open(mode)) {
        const std::string deviceError = m_device->GetErrorString();
        const std::string message = std::string("could not open BGZF stream: \n\t") + deviceError;
        throw BamException("BgzfStream::Open", message);
    }
}